

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Frame.cpp
# Opt level: O3

void __thiscall IRT::CFrame::addAddress(CFrame *this,string *name,IAddress *address)

{
  IAddress *local_10;
  
  local_10 = address;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<IRT::IAddress_const,std::default_delete<IRT::IAddress_const>>>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<IRT::IAddress_const,std::default_delete<IRT::IAddress_const>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_emplace<std::__cxx11::string_const&,std::unique_ptr<IRT::IAddress_const,std::default_delete<IRT::IAddress_const>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<IRT::IAddress_const,std::default_delete<IRT::IAddress_const>>>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<IRT::IAddress_const,std::default_delete<IRT::IAddress_const>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&this->localVisibilityAddresses,name,&local_10);
  if (local_10 != (IAddress *)0x0) {
    (*local_10->_vptr_IAddress[1])();
  }
  return;
}

Assistant:

void CFrame::addAddress(const std::string &name, const IAddress *address) {
    auto result = localVisibilityAddresses.emplace(name, std::unique_ptr<const IAddress>(address));
    // overwriting may happen in case there is a field and a local/argument with the same name
    // assert( result.second );
}